

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5.cc
# Opt level: O0

void __thiscall trng::yarn5::yarn5(yarn5 *this,unsigned_long s,parameter_type *P)

{
  undefined8 *in_RDX;
  unsigned_long in_RSI;
  yarn5 *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = *in_RDX;
  *(undefined8 *)((in_RDI->P).a + 2) = in_RDX[1];
  (in_RDI->P).a[4] = *(int *)(in_RDX + 2);
  mrg_status<int,_5,_trng::yarn5>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

yarn5::yarn5(unsigned long s, const parameter_type &P) : P(P), S() { seed(s); }